

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

void ini_property_add(ini_t *ini,int section,char *name,int name_length,char *value,int value_length
                     )

{
  ini_internal_property_t *__dest;
  char *pcVar1;
  ini_internal_property_t *new_properties;
  int value_length_local;
  char *value_local;
  int name_length_local;
  char *name_local;
  int section_local;
  ini_t *ini_local;
  
  if ((((ini != (ini_t *)0x0) && (name != (char *)0x0)) && (-1 < section)) &&
     (section < ini->section_count)) {
    value_local._4_4_ = name_length;
    if (name_length < 1) {
      value_local._4_4_ = sx_strlen(name);
    }
    new_properties._4_4_ = value_length;
    if (value_length < 1) {
      new_properties._4_4_ = sx_strlen(value);
    }
    if (ini->property_capacity <= ini->property_count) {
      ini->property_capacity = ini->property_capacity << 1;
      __dest = (ini_internal_property_t *)
               sx__malloc((sx_alloc *)ini->memctx,(long)ini->property_capacity * 0x78,0,(char *)0x0,
                          (char *)0x0,0);
      memcpy(__dest,ini->properties,(long)ini->property_count * 0x78);
      sx__free((sx_alloc *)ini->memctx,ini->properties,0,(char *)0x0,(char *)0x0,0);
      ini->properties = __dest;
    }
    ini->properties[ini->property_count].section = section;
    ini->properties[ini->property_count].name_large = (char *)0x0;
    ini->properties[ini->property_count].value_large = (char *)0x0;
    if (value_local._4_4_ + 1U < 0x20) {
      memcpy(ini->properties[ini->property_count].name,name,(long)value_local._4_4_);
      ini->properties[ini->property_count].name[value_local._4_4_] = '\0';
    }
    else {
      pcVar1 = (char *)sx__malloc((sx_alloc *)ini->memctx,(long)value_local._4_4_ + 1,0,(char *)0x0,
                                  (char *)0x0,0);
      ini->properties[ini->property_count].name_large = pcVar1;
      memcpy(ini->properties[ini->property_count].name_large,name,(long)value_local._4_4_);
      ini->properties[ini->property_count].name_large[value_local._4_4_] = '\0';
    }
    if (new_properties._4_4_ + 1U < 0x40) {
      memcpy(ini->properties[ini->property_count].value,value,(long)new_properties._4_4_);
      ini->properties[ini->property_count].value[new_properties._4_4_] = '\0';
    }
    else {
      pcVar1 = (char *)sx__malloc((sx_alloc *)ini->memctx,(long)new_properties._4_4_ + 1,0,
                                  (char *)0x0,(char *)0x0,0);
      ini->properties[ini->property_count].value_large = pcVar1;
      memcpy(ini->properties[ini->property_count].value_large,value,(long)new_properties._4_4_);
      ini->properties[ini->property_count].value_large[new_properties._4_4_] = '\0';
    }
    ini->property_count = ini->property_count + 1;
  }
  return;
}

Assistant:

void ini_property_add( ini_t* ini, int section, char const* name, int name_length, char const* value, int value_length )
    {
    struct ini_internal_property_t* new_properties;

    if( ini && name && section >= 0 && section < ini->section_count )
        {
        if( name_length <= 0 ) name_length = (int) INI_STRLEN( name );
        if( value_length <= 0 ) value_length = (int) INI_STRLEN( value );

        if( ini->property_count >= ini->property_capacity )
            {

            ini->property_capacity *= 2;
            new_properties = (struct ini_internal_property_t*) INI_MALLOC( ini->memctx, 
                ini->property_capacity * sizeof( ini->properties[ 0 ] ) );
            INI_MEMCPY( new_properties, ini->properties, ini->property_count * sizeof( ini->properties[ 0 ] ) );
            INI_FREE( ini->memctx, ini->properties );
            ini->properties = new_properties;
            }
        
        ini->properties[ ini->property_count ].section = section;
        ini->properties[ ini->property_count ].name_large = 0;
        ini->properties[ ini->property_count ].value_large = 0;

        if( name_length + 1 >= sizeof( ini->properties[ 0 ].name ) )
            {
            ini->properties[ ini->property_count ].name_large = (char*) INI_MALLOC( ini->memctx, (size_t) name_length + 1 );
            INI_MEMCPY( ini->properties[ ini->property_count ].name_large, name, (size_t) name_length );
            ini->properties[ ini->property_count ].name_large[ name_length ] = '\0';
            }
        else
            {
            INI_MEMCPY( ini->properties[ ini->property_count ].name, name, (size_t) name_length );
            ini->properties[ ini->property_count ].name[ name_length ] = '\0';
            }

        if( value_length + 1 >= sizeof( ini->properties[ 0 ].value ) )
            {
            ini->properties[ ini->property_count ].value_large = (char*) INI_MALLOC( ini->memctx, (size_t) value_length + 1 );
            INI_MEMCPY( ini->properties[ ini->property_count ].value_large, value, (size_t) value_length );
            ini->properties[ ini->property_count ].value_large[ value_length ] = '\0';
            }
        else
            {
            INI_MEMCPY( ini->properties[ ini->property_count ].value, value, (size_t) value_length );
            ini->properties[ ini->property_count ].value[ value_length ] = '\0';
            }

        ++ini->property_count;
        }
    }